

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderBuiltinConstantTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::ShaderBuiltinConstantTests::init
          (ShaderBuiltinConstantTests *this,EVP_PKEY_CTX *ctx)

{
  Context *context;
  char *__s;
  size_type sVar1;
  TestNode *pTVar2;
  ShaderBuiltinConstantCase<int> *pSVar3;
  TestCase *this_00;
  TestNode *pTVar4;
  undefined8 extraout_RAX;
  undefined8 uVar5;
  undefined8 extraout_RAX_00;
  long lVar6;
  allocator<char> local_89;
  TestNode *local_88;
  TestNode *local_80;
  long local_78;
  string local_70;
  string local_50;
  
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"core",
             "Core Specification");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  for (lVar6 = 8; lVar6 != 0x1d8; lVar6 = lVar6 + 0x10) {
    pSVar3 = (ShaderBuiltinConstantCase<int> *)operator_new(0xc0);
    anon_unknown_1::ShaderBuiltinConstantCase<int>::ShaderBuiltinConstantCase
              (pSVar3,(this->super_TestCaseGroup).m_context,*(char **)(&UNK_01e60b88 + lVar6),
               *(GetConstantValueFunc *)((long)&init::intConstants[0].varName + lVar6),(char *)0x0);
    tcu::TestNode::addChild(pTVar2,(TestNode *)pSVar3);
  }
  lVar6 = 0;
  local_88 = (TestNode *)this;
  local_80 = pTVar2;
  while (lVar6 != 0x20) {
    this_00 = (TestCase *)operator_new(0xc0);
    context = (Context *)local_88[1]._vptr_TestNode;
    __s = *(char **)((long)&init::ivec3Constants[0].varName + lVar6);
    sVar1 = *(size_type *)((long)&init::ivec3Constants[0].getValue + lVar6);
    local_78 = lVar6;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,__s,&local_89);
    anon_unknown_1::makeCaseName(&local_70,&local_50);
    gles31::TestCase::TestCase(this_00,context,local_70._M_dataplus._M_p,__s);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    (this_00->super_TestCase).super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ShaderBuiltinConstantCase_01e60fa8;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(this_00 + 1),__s,(allocator<char> *)&local_70);
    this_00[1].super_TestCase.super_TestNode.m_name.field_2._M_allocated_capacity = sVar1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(this_00[1].super_TestCase.super_TestNode.m_name.field_2._M_local_buf + 8),
               glcts::fixed_sample_locations_values + 1,(allocator<char> *)&local_70);
    tcu::TestNode::addChild(local_80,(TestNode *)this_00);
    lVar6 = local_78 + 0x10;
  }
  pTVar4 = (TestNode *)operator_new(0x70);
  pTVar2 = local_88;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,local_88->m_testCtx,"sample_variables",
             "GL_OES_sample_variables");
  tcu::TestNode::addChild(pTVar2,pTVar4);
  pSVar3 = (ShaderBuiltinConstantCase<int> *)operator_new(0xc0);
  anon_unknown_1::ShaderBuiltinConstantCase<int>::ShaderBuiltinConstantCase
            (pSVar3,(Context *)pTVar2[1]._vptr_TestNode,"gl_MaxSamples",
             Functional::(anonymous_namespace)::getInteger<36183u>,"GL_OES_sample_variables");
  tcu::TestNode::addChild(pTVar4,(TestNode *)pSVar3);
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,pTVar2->m_testCtx,"geometry_shader","GL_EXT_geometry_shader");
  tcu::TestNode::addChild(pTVar2,pTVar4);
  for (lVar6 = 8; lVar6 != 0x98; lVar6 = lVar6 + 0x10) {
    pSVar3 = (ShaderBuiltinConstantCase<int> *)operator_new(0xc0);
    anon_unknown_1::ShaderBuiltinConstantCase<int>::ShaderBuiltinConstantCase
              (pSVar3,(Context *)pTVar2[1]._vptr_TestNode,
               *(char **)((long)&init::ivec3Constants[1].getValue + lVar6),
               *(GetConstantValueFunc *)((long)&init()::intConstants[0].varName + lVar6),
               "GL_EXT_geometry_shader");
    tcu::TestNode::addChild(pTVar4,(TestNode *)pSVar3);
  }
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,pTVar2->m_testCtx,"tessellation_shader",
             "GL_EXT_tessellation_shader");
  tcu::TestNode::addChild(pTVar2,pTVar4);
  uVar5 = extraout_RAX;
  for (lVar6 = 8; lVar6 != 0x128; lVar6 = lVar6 + 0x10) {
    pSVar3 = (ShaderBuiltinConstantCase<int> *)operator_new(0xc0);
    anon_unknown_1::ShaderBuiltinConstantCase<int>::ShaderBuiltinConstantCase
              (pSVar3,(Context *)pTVar2[1]._vptr_TestNode,
               *(char **)((long)&init()::intConstants[8].getValue + lVar6),
               *(GetConstantValueFunc *)((long)&init()::intConstants[0].varName + lVar6),
               "GL_EXT_tessellation_shader");
    tcu::TestNode::addChild(pTVar4,(TestNode *)pSVar3);
    uVar5 = extraout_RAX_00;
  }
  return (int)uVar5;
}

Assistant:

void ShaderBuiltinConstantTests::init (void)
{
	// Core builtin constants
	{
		static const struct
		{
			const char*												varName;
			ShaderBuiltinConstantCase<int>::GetConstantValueFunc	getValue;
		} intConstants[] =
		{
			{ "gl_MaxVertexAttribs",					getInteger<GL_MAX_VERTEX_ATTRIBS>						},
			{ "gl_MaxVertexUniformVectors",				getInteger<GL_MAX_VERTEX_UNIFORM_VECTORS>				},
			{ "gl_MaxVertexOutputVectors",				getVectorsFromComps<GL_MAX_VERTEX_OUTPUT_COMPONENTS>	},
			{ "gl_MaxFragmentInputVectors",				getVectorsFromComps<GL_MAX_FRAGMENT_INPUT_COMPONENTS>	},
			{ "gl_MaxFragmentUniformVectors",			getInteger<GL_MAX_FRAGMENT_UNIFORM_VECTORS>				},
			{ "gl_MaxDrawBuffers",						getInteger<GL_MAX_DRAW_BUFFERS>							},

			{ "gl_MaxVertexTextureImageUnits",			getInteger<GL_MAX_VERTEX_TEXTURE_IMAGE_UNITS>			},
			{ "gl_MaxCombinedTextureImageUnits",		getInteger<GL_MAX_COMBINED_TEXTURE_IMAGE_UNITS>			},
			{ "gl_MaxTextureImageUnits",				getInteger<GL_MAX_TEXTURE_IMAGE_UNITS>					},

			{ "gl_MinProgramTexelOffset",				getInteger<GL_MIN_PROGRAM_TEXEL_OFFSET>					},
			{ "gl_MaxProgramTexelOffset",				getInteger<GL_MAX_PROGRAM_TEXEL_OFFSET>					},

			{ "gl_MaxImageUnits",						getInteger<GL_MAX_IMAGE_UNITS>							},
			{ "gl_MaxVertexImageUniforms",				getInteger<GL_MAX_VERTEX_IMAGE_UNIFORMS>				},
			{ "gl_MaxFragmentImageUniforms",			getInteger<GL_MAX_FRAGMENT_IMAGE_UNIFORMS>				},
			{ "gl_MaxComputeImageUniforms",				getInteger<GL_MAX_COMPUTE_IMAGE_UNIFORMS>				},
			{ "gl_MaxCombinedImageUniforms",			getInteger<GL_MAX_COMBINED_IMAGE_UNIFORMS>				},

			{ "gl_MaxCombinedShaderOutputResources",	getInteger<GL_MAX_COMBINED_SHADER_OUTPUT_RESOURCES>		},

			{ "gl_MaxComputeUniformComponents",			getInteger<GL_MAX_COMPUTE_UNIFORM_COMPONENTS>			},
			{ "gl_MaxComputeTextureImageUnits",			getInteger<GL_MAX_COMPUTE_TEXTURE_IMAGE_UNITS>			},

			{ "gl_MaxComputeAtomicCounters",			getInteger<GL_MAX_COMPUTE_ATOMIC_COUNTERS>				},
			{ "gl_MaxComputeAtomicCounterBuffers",		getInteger<GL_MAX_COMPUTE_ATOMIC_COUNTER_BUFFERS>		},

			{ "gl_MaxVertexAtomicCounters",				getInteger<GL_MAX_VERTEX_ATOMIC_COUNTERS>				},
			{ "gl_MaxFragmentAtomicCounters",			getInteger<GL_MAX_FRAGMENT_ATOMIC_COUNTERS>				},
			{ "gl_MaxCombinedAtomicCounters",			getInteger<GL_MAX_COMBINED_ATOMIC_COUNTERS>				},
			{ "gl_MaxAtomicCounterBindings",			getInteger<GL_MAX_ATOMIC_COUNTER_BUFFER_BINDINGS>		},

			{ "gl_MaxVertexAtomicCounterBuffers",		getInteger<GL_MAX_VERTEX_ATOMIC_COUNTER_BUFFERS>		},
			{ "gl_MaxFragmentAtomicCounterBuffers",		getInteger<GL_MAX_FRAGMENT_ATOMIC_COUNTER_BUFFERS>		},
			{ "gl_MaxCombinedAtomicCounterBuffers",		getInteger<GL_MAX_COMBINED_ATOMIC_COUNTER_BUFFERS>		},
			{ "gl_MaxAtomicCounterBufferSize",			getInteger<GL_MAX_ATOMIC_COUNTER_BUFFER_SIZE>			},
		};

		static const struct
		{
			const char*													varName;
			ShaderBuiltinConstantCase<tcu::IVec3>::GetConstantValueFunc	getValue;
		} ivec3Constants[] =
		{
			{ "gl_MaxComputeWorkGroupCount",			getIVec3<GL_MAX_COMPUTE_WORK_GROUP_COUNT>				},
			{ "gl_MaxComputeWorkGroupSize",				getIVec3<GL_MAX_COMPUTE_WORK_GROUP_SIZE>				},
		};

		tcu::TestCaseGroup* const coreGroup = new tcu::TestCaseGroup(m_testCtx, "core", "Core Specification");
		addChild(coreGroup);

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(intConstants); ndx++)
			coreGroup->addChild(new ShaderBuiltinConstantCase<int>(m_context, intConstants[ndx].varName, intConstants[ndx].getValue, DE_NULL));

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(ivec3Constants); ndx++)
			coreGroup->addChild(new ShaderBuiltinConstantCase<tcu::IVec3>(m_context, ivec3Constants[ndx].varName, ivec3Constants[ndx].getValue, DE_NULL));
	}

	// OES_sample_variables
	{
		tcu::TestCaseGroup* const sampleVarGroup = new tcu::TestCaseGroup(m_testCtx, "sample_variables", "GL_OES_sample_variables");
		addChild(sampleVarGroup);
		sampleVarGroup->addChild(new ShaderBuiltinConstantCase<int>(m_context, "gl_MaxSamples", getInteger<GL_MAX_SAMPLES>, "GL_OES_sample_variables"));
	}

	// EXT_geometry_shader
	{
		static const struct
		{
			const char*												varName;
			ShaderBuiltinConstantCase<int>::GetConstantValueFunc	getValue;
		} intConstants[] =
		{
			{ "gl_MaxGeometryInputComponents",			getInteger<GL_MAX_GEOMETRY_INPUT_COMPONENTS>			},
			{ "gl_MaxGeometryOutputComponents",			getInteger<GL_MAX_GEOMETRY_OUTPUT_COMPONENTS>			},
			{ "gl_MaxGeometryImageUniforms",			getInteger<GL_MAX_GEOMETRY_IMAGE_UNIFORMS>				},
			{ "gl_MaxGeometryTextureImageUnits",		getInteger<GL_MAX_GEOMETRY_TEXTURE_IMAGE_UNITS>			},
			{ "gl_MaxGeometryOutputVertices",			getInteger<GL_MAX_GEOMETRY_OUTPUT_VERTICES>				},
			{ "gl_MaxGeometryTotalOutputComponents",	getInteger<GL_MAX_GEOMETRY_TOTAL_OUTPUT_COMPONENTS>		},
			{ "gl_MaxGeometryUniformComponents",		getInteger<GL_MAX_GEOMETRY_UNIFORM_COMPONENTS>			},
			{ "gl_MaxGeometryAtomicCounters",			getInteger<GL_MAX_GEOMETRY_ATOMIC_COUNTERS>				},
			{ "gl_MaxGeometryAtomicCounterBuffers",		getInteger<GL_MAX_GEOMETRY_ATOMIC_COUNTER_BUFFERS>		},
		};

		tcu::TestCaseGroup* const geomGroup = new tcu::TestCaseGroup(m_testCtx, "geometry_shader", "GL_EXT_geometry_shader");
		addChild(geomGroup);

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(intConstants); ndx++)
			geomGroup->addChild(new ShaderBuiltinConstantCase<int>(m_context, intConstants[ndx].varName, intConstants[ndx].getValue, "GL_EXT_geometry_shader"));
	}

	// EXT_tessellation_shader
	{
		static const struct
		{
			const char*												varName;
			ShaderBuiltinConstantCase<int>::GetConstantValueFunc	getValue;
		} intConstants[] =
		{
			{ "gl_MaxTessControlInputComponents",			getInteger<GL_MAX_TESS_CONTROL_INPUT_COMPONENTS>			},
			{ "gl_MaxTessControlOutputComponents",			getInteger<GL_MAX_TESS_CONTROL_OUTPUT_COMPONENTS>			},
			{ "gl_MaxTessControlTextureImageUnits",			getInteger<GL_MAX_TESS_CONTROL_TEXTURE_IMAGE_UNITS>			},
			{ "gl_MaxTessControlUniformComponents",			getInteger<GL_MAX_TESS_CONTROL_UNIFORM_COMPONENTS>			},
			{ "gl_MaxTessControlTotalOutputComponents",		getInteger<GL_MAX_TESS_CONTROL_TOTAL_OUTPUT_COMPONENTS>		},

			{ "gl_MaxTessControlImageUniforms",				getInteger<GL_MAX_TESS_CONTROL_IMAGE_UNIFORMS>				},
			{ "gl_MaxTessEvaluationImageUniforms",			getInteger<GL_MAX_TESS_EVALUATION_IMAGE_UNIFORMS>			},
			{ "gl_MaxTessControlAtomicCounters",			getInteger<GL_MAX_TESS_CONTROL_ATOMIC_COUNTERS>				},
			{ "gl_MaxTessEvaluationAtomicCounters",			getInteger<GL_MAX_TESS_EVALUATION_ATOMIC_COUNTERS>			},
			{ "gl_MaxTessControlAtomicCounterBuffers",		getInteger<GL_MAX_TESS_CONTROL_ATOMIC_COUNTER_BUFFERS>		},
			{ "gl_MaxTessEvaluationAtomicCounterBuffers",	getInteger<GL_MAX_TESS_EVALUATION_ATOMIC_COUNTER_BUFFERS>	},

			{ "gl_MaxTessEvaluationInputComponents",		getInteger<GL_MAX_TESS_EVALUATION_INPUT_COMPONENTS>			},
			{ "gl_MaxTessEvaluationOutputComponents",		getInteger<GL_MAX_TESS_EVALUATION_OUTPUT_COMPONENTS>		},
			{ "gl_MaxTessEvaluationTextureImageUnits",		getInteger<GL_MAX_TESS_EVALUATION_TEXTURE_IMAGE_UNITS>		},
			{ "gl_MaxTessEvaluationUniformComponents",		getInteger<GL_MAX_TESS_EVALUATION_UNIFORM_COMPONENTS>		},

			{ "gl_MaxTessPatchComponents",					getInteger<GL_MAX_TESS_PATCH_COMPONENTS>					},

			{ "gl_MaxPatchVertices",						getInteger<GL_MAX_PATCH_VERTICES>							},
			{ "gl_MaxTessGenLevel",							getInteger<GL_MAX_TESS_GEN_LEVEL>							},
		};

		tcu::TestCaseGroup* const tessGroup = new tcu::TestCaseGroup(m_testCtx, "tessellation_shader", "GL_EXT_tessellation_shader");
		addChild(tessGroup);

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(intConstants); ndx++)
			tessGroup->addChild(new ShaderBuiltinConstantCase<int>(m_context, intConstants[ndx].varName, intConstants[ndx].getValue, "GL_EXT_tessellation_shader"));
	}
}